

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O2

void dlib::blas_bindings::
     matrix_assign_blas_proxy<dlib::assignable_ptr_matrix<float>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
               *src,type alpha,bool add_to,bool transpose)

{
  matrix_assign_blas_proxy<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>
            (dest,src->lhs,alpha,add_to,transpose);
  matrix_assign_blas_proxy<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>
            (dest,src->rhs,alpha,true,transpose);
  return;
}

Assistant:

void matrix_assign_blas_proxy (
            dest_exp& dest,
            const matrix_add_exp<src_exp, src_exp2>& src,
            typename src_exp::type alpha,
            bool add_to,
            bool transpose
        )
        {
            if (has_matrix_multiply<src_exp>::value || has_matrix_multiply<src_exp2>::value)
            {
                matrix_assign_blas_proxy(dest, src.lhs, alpha, add_to, transpose);
                matrix_assign_blas_proxy(dest, src.rhs, alpha, true, transpose);
            }
            else
            {
                if (transpose == false)
                    matrix_assign_default(dest, src, alpha, add_to);
                else
                    matrix_assign_default(dest, trans(src), alpha, add_to);
            }
        }